

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O2

int getEncodingIndex(char *name)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  
  if (name == (char *)0x0) {
    iVar2 = 6;
  }
  else {
    iVar2 = -1;
    piVar3 = &getEncodingIndex_encodingNames_rel;
    for (lVar4 = 0; lVar4 != 6; lVar4 = lVar4 + 1) {
      iVar1 = streqci(name,(char *)((long)&getEncodingIndex_encodingNames_rel + (long)*piVar3));
      if (iVar1 != 0) {
        return (int)lVar4;
      }
      piVar3 = piVar3 + 1;
    }
  }
  return iVar2;
}

Assistant:

static
int getEncodingIndex(const char *name)
{
  static const char *encodingNames[] = {
    KW_ISO_8859_1,
    KW_US_ASCII,
    KW_UTF_8,
    KW_UTF_16,
    KW_UTF_16BE,
    KW_UTF_16LE,
  };
  int i;
  if (name == 0)
    return NO_ENC;
  for (i = 0; i < (int)(sizeof(encodingNames)/sizeof(encodingNames[0])); i++)
    if (streqci(name, encodingNames[i]))
      return i;
  return UNKNOWN_ENC;
}